

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O0

void gflags::anon_unknown_5::Test_FlagFileTest_FailReadFlagsFromString::RunTest(void)

{
  bool bVar1;
  char *pcVar2;
  allocator local_29;
  string local_28 [8];
  string flags;
  
  fLI::FLAGS_test_int32 = 0x77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,
             "# let\'s make sure it can update values\n-test_string=non_initial\n-test_bool=false\n-test_int32=123\n-test_double=illegal\n"
             ,&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  pcVar2 = GetArgv0();
  bVar1 = ReadFlagsFromString((string *)local_28,pcVar2,false);
  if (bVar1) {
    fprintf(_stderr,"Check failed: %s\n","!(ReadFlagsFromString(flags, GetArgv0(), false))");
    exit(1);
  }
  if (fLI::FLAGS_test_int32 != 0x77) {
    fprintf(_stderr,"Check failed: %s %s %s\n","119","==","FLAGS_test_int32");
    exit(1);
  }
  bVar1 = std::operator==("initial",fLS::FLAGS_test_string_abi_cxx11_);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s %s %s\n","\"initial\"","==","FLAGS_test_string");
    exit(1);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(FlagFileTest, FailReadFlagsFromString) {
  FLAGS_test_int32 = 119;
  string flags("# let's make sure it can update values\n"
               "-test_string=non_initial\n"
               "-test_bool=false\n"
               "-test_int32=123\n"
               "-test_double=illegal\n");

  EXPECT_FALSE(ReadFlagsFromString(flags,
                                   GetArgv0(),
                                   // errors are fatal
                                   false));

  EXPECT_EQ(119, FLAGS_test_int32);
  EXPECT_EQ("initial", FLAGS_test_string);
}